

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int transfer_set_batchable(TRANSFER_HANDLE transfer,_Bool batchable_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  TRANSFER_INSTANCE *transfer_instance;
  
  if (transfer == (TRANSFER_HANDLE)0x0) {
    iVar2 = 0x2000;
  }
  else {
    item_value = amqpvalue_create_boolean(batchable_value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x2008;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(transfer->composite_value,10,item_value);
      iVar2 = 0x200e;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int transfer_set_batchable(TRANSFER_HANDLE transfer, bool batchable_value)
{
    int result;

    if (transfer == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        TRANSFER_INSTANCE* transfer_instance = (TRANSFER_INSTANCE*)transfer;
        AMQP_VALUE batchable_amqp_value = amqpvalue_create_boolean(batchable_value);
        if (batchable_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(transfer_instance->composite_value, 10, batchable_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(batchable_amqp_value);
        }
    }

    return result;
}